

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
tinyusdz::GeomMesh::get_faceVertexCounts
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GeomMesh *this,double time)

{
  bool bVar1;
  value_type *this_00;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> val;
  optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> pv;
  double time_local;
  GeomMesh *this_local;
  vector<int,_std::allocator<int>_> *dst;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::authored
                    (&this->faceVertexCounts);
  if (((bVar1) &&
      (bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
               is_blocked(&this->faceVertexCounts), !bVar1)) &&
     (bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
              is_connection(&this->faceVertexCounts), !bVar1)) {
    TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::get_value
              ((optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
               &val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,&this->faceVertexCounts);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                      ((optional *)
                       &val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_88);
      this_00 = nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::value
                          ((optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                            *)&val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
      bVar1 = Animatable<std::vector<int,_std::allocator<int>_>_>::get
                        (this_00,time,(vector<int,_std::allocator<int>_> *)local_88,Held);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  (__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)local_88);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88)
      ;
    }
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
    ::~optional((optional<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                &val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<int32_t> GeomMesh::get_faceVertexCounts(double time) const {
  std::vector<int32_t> dst;

  if (!faceVertexCounts.authored() || faceVertexCounts.is_blocked()) {
    return dst;
  }

  if (faceVertexCounts.is_connection()) {
    // TODO: connection
    return dst;
  }

  if (auto pv = faceVertexCounts.get_value()) {
    std::vector<int32_t> val;
    if (pv.value().get(time, &val, value::TimeSampleInterpolationType::Held)) {
      dst = std::move(val);
    }
  }
  return dst;
}